

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall Glucose::Clause::shrink(Clause *this,int i)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = *(ulong *)&this->header;
  iVar3 = (int)(uVar1 >> 0x20);
  if ((uVar1 & 0x30) == 0) {
    uVar2 = (ulong)(uint)(iVar3 - i);
  }
  else {
    uVar2 = (ulong)(uint)(iVar3 - i);
    *(undefined4 *)(&this[1].header.field_0x0 + uVar2 * 4) =
         *(undefined4 *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4);
    if ((uVar1 & 0x20) != 0) {
      *(undefined4 *)(&this[1].header.field_0x0 + (ulong)(uint)(~i + iVar3) * 4) =
           *(undefined4 *)(&this[1].header.field_0x0 + (ulong)(iVar3 - 1) * 4);
    }
  }
  *(ulong *)&this->header = uVar1 & 0xffffffff | uVar2 << 0x20;
  return;
}

Assistant:

void         shrink      (int i)         { assert(i <= size()); 
						if (header.extra_size > 0) {
						    data[header.size-i] = data[header.size];
						    if (header.extra_size > 1) { // Special case for imported clauses
							data[header.size-i-1] = data[header.size-1];
						    }
						}
    header.size -= i; }